

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset_wire_format.pb.cc
# Opt level: O1

void __thiscall
proto2_wireformat_unittest::TestMessageSetWireFormatContainer::~TestMessageSetWireFormatContainer
          (TestMessageSetWireFormatContainer *this)

{
  ~TestMessageSetWireFormatContainer(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestMessageSetWireFormatContainer::~TestMessageSetWireFormatContainer() {
  // @@protoc_insertion_point(destructor:proto2_wireformat_unittest.TestMessageSetWireFormatContainer)
  SharedDtor(*this);
}